

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_test.cpp
# Opt level: O3

void __thiscall Parallel_ForEachThread_Test::TestBody(Parallel_ForEachThread_Test *this)

{
  bool bVar1;
  char *message;
  atomic<int> count;
  AssertionResult gtest_ar;
  Message local_50;
  AssertHelper local_48;
  atomic<int> local_3c;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_3c.super___atomic_base<int>._M_i = (__atomic_base<int>)pbrt::MaxThreadIndex();
  local_28._M_unused._M_object = &local_3c;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel_test.cpp:44:19)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel_test.cpp:44:19)>
             ::_M_manager;
  pbrt::ForEachThread((function<void_()> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  local_50.ss_.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,std::atomic<int>>
            (local_38,"0","count",(int *)&local_50,&local_3c);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message(&local_50);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel_test.cpp"
               ,0x2d,message);
    testing::internal::AssertHelper::operator=(&local_48,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Parallel, ForEachThread) {
    std::atomic<int> count{MaxThreadIndex()};
    ForEachThread([&count] { --count; });
    EXPECT_EQ(0, count);
}